

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall spirv_cross::Compiler::block_is_noop(Compiler *this,SPIRBlock *block)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  size_t sVar4;
  SPIRBlock *pSVar5;
  uint32_t *puVar6;
  SPIRExtension *pSVar7;
  long lVar8;
  Instruction *i;
  Instruction *instr;
  bool bVar9;
  
  if (*(int *)&(block->super_IVariant).field_0xc == 1) {
    pSVar5 = Variant::get<spirv_cross::SPIRBlock>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        (block->next_block).id);
    sVar4 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size;
    if (sVar4 != 0) {
      lVar8 = 0;
      do {
        uVar2 = *(uint32_t *)
                 ((long)&(((block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr)
                         ->parent).id + lVar8);
        if (uVar2 == (block->super_IVariant).self.id) {
          return false;
        }
        if (uVar2 == (pSVar5->super_IVariant).self.id) {
          return false;
        }
        lVar8 = lVar8 + 0xc;
      } while (sVar4 * 0xc != lVar8);
    }
    sVar4 = (pSVar5->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size;
    if (sVar4 != 0) {
      lVar8 = 0;
      do {
        if (*(uint32_t *)
             ((long)&(((pSVar5->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr)->
                     parent).id + lVar8) == (block->super_IVariant).self.id) goto LAB_00392664;
        lVar8 = lVar8 + 0xc;
      } while (sVar4 * 0xc != lVar8);
    }
    sVar4 = (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
    bVar9 = sVar4 == 0;
    if (!bVar9) {
      instr = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
      lVar8 = sVar4 * 0xc;
      do {
        uVar1 = instr->op;
        if ((uVar1 != 8) && (uVar1 != 0x13d)) {
          if (uVar1 != 0xc) {
            return bVar9;
          }
          puVar6 = stream(this,instr);
          pSVar7 = Variant::get<spirv_cross::SPIRExtension>
                             ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + puVar6[2])
          ;
          uVar3 = *(uint *)&(pSVar7->super_IVariant).field_0xc;
          if (9 < uVar3) {
            return bVar9;
          }
          if ((0x304U >> (uVar3 & 0x1f) & 1) == 0) {
            return bVar9;
          }
        }
        instr = instr + 1;
        lVar8 = lVar8 + -0xc;
        bVar9 = lVar8 == 0;
      } while (!bVar9);
    }
  }
  else {
LAB_00392664:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool Compiler::block_is_noop(const SPIRBlock &block) const
{
	if (block.terminator != SPIRBlock::Direct)
		return false;

	auto &child = get<SPIRBlock>(block.next_block);

	// If this block participates in PHI, the block isn't really noop.
	for (auto &phi : block.phi_variables)
		if (phi.parent == block.self || phi.parent == child.self)
			return false;

	for (auto &phi : child.phi_variables)
		if (phi.parent == block.self)
			return false;

	// Verify all instructions have no semantic impact.
	for (auto &i : block.ops)
	{
		auto op = static_cast<Op>(i.op);

		switch (op)
		{
		// Non-Semantic instructions.
		case OpLine:
		case OpNoLine:
			break;

		case OpExtInst:
		{
			auto *ops = stream(i);
			auto ext = get<SPIRExtension>(ops[2]).ext;

			bool ext_is_nonsemantic_only =
				ext == SPIRExtension::NonSemanticShaderDebugInfo ||
				ext == SPIRExtension::SPV_debug_info ||
				ext == SPIRExtension::NonSemanticGeneric;

			if (!ext_is_nonsemantic_only)
				return false;

			break;
		}

		default:
			return false;
		}
	}

	return true;
}